

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

void __thiscall
BaseIndex::BaseIndex
          (BaseIndex *this,
          unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> chain,string name)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  long lVar6;
  long *in_RDX;
  long in_FS_OFFSET;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_CValidationInterface)._vptr_CValidationInterface =
       (_func_int **)&PTR_UpdatedBlockTip_013db7d8;
  this->m_init = (__atomic_base<bool>)0x0;
  this->m_synced = (__atomic_base<bool>)0x0;
  (this->m_best_block_index)._M_b._M_p = (__pointer_type)0x0;
  (this->m_thread_sync)._M_id._M_thread = 0;
  CThreadInterrupt::CThreadInterrupt(&this->m_interrupt);
  (this->m_chain)._M_t.
  super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t.
  super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
  super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl =
       *(Chain **)
        chain._M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>
        ._M_t.super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
        super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  *(undefined8 *)
   chain._M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>._M_t
   .super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>.
   super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl = 0;
  this->m_chainstate = (Chainstate *)0x0;
  paVar2 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)paVar2;
  psVar1 = (size_type *)(in_RDX + 2);
  if ((size_type *)*in_RDX == psVar1) {
    uVar4 = *(undefined4 *)((long)in_RDX + 0x14);
    lVar6 = in_RDX[3];
    uVar5 = *(undefined4 *)((long)in_RDX + 0x1c);
    *(int *)paVar2 = (int)*psVar1;
    *(undefined4 *)((long)&(this->m_name).field_2 + 4) = uVar4;
    *(int *)((long)&(this->m_name).field_2 + 8) = (int)lVar6;
    *(undefined4 *)((long)&(this->m_name).field_2 + 0xc) = uVar5;
  }
  else {
    (this->m_name)._M_dataplus._M_p = (pointer)*in_RDX;
    (this->m_name).field_2._M_allocated_capacity = *psVar1;
  }
  (this->m_name)._M_string_length = in_RDX[1];
  *in_RDX = (long)psVar1;
  in_RDX[1] = 0;
  *(undefined1 *)(in_RDX + 2) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BaseIndex::BaseIndex(std::unique_ptr<interfaces::Chain> chain, std::string name)
    : m_chain{std::move(chain)}, m_name{std::move(name)} {}